

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O1

int Gia_ObjFanin1CopyCarry(Vec_Int_t *vCarries,Gia_Obj_t *pObj,int Id)

{
  uint uVar1;
  uint uVar2;
  
  if (vCarries != (Vec_Int_t *)0x0) {
    uVar1 = (uint)((ulong)*(undefined8 *)pObj >> 0x20);
    uVar2 = Id - (uVar1 & 0x1fffffff);
    if (((int)uVar2 < 0) || (vCarries->nSize <= (int)uVar2)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    uVar2 = vCarries->pArray[uVar2];
    if (uVar2 != 0xffffffff) {
      if (-1 < (int)uVar2) {
        return uVar2 ^ uVar1 >> 0x1d & 1;
      }
      goto LAB_00672ec5;
    }
  }
  uVar1 = (uint)((ulong)*(undefined8 *)pObj >> 0x20);
  if (-1 < (int)pObj[-(ulong)(uVar1 & 0x1fffffff)].Value) {
    return uVar1 >> 0x1d & 1 ^ pObj[-(ulong)(uVar1 & 0x1fffffff)].Value;
  }
LAB_00672ec5:
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                ,0x132,"int Abc_LitNotCond(int, int)");
}

Assistant:

int Gia_ObjFanin1CopyCarry( Vec_Int_t * vCarries, Gia_Obj_t * pObj, int Id )
{
    if ( vCarries == NULL || Vec_IntEntry(vCarries, Gia_ObjFaninId1(pObj, Id)) == -1 )
        return Gia_ObjFanin1Copy(pObj);
    return Abc_LitNotCond( Vec_IntEntry(vCarries, Gia_ObjFaninId1(pObj, Id)), Gia_ObjFaninC1(pObj) );
}